

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_default_nan_riscv64(float_status *status)

{
  return (float128)(ZEXT816(0x7fff800000000000) << 0x40);
}

Assistant:

float128 float128_default_nan(float_status *status)
{
    FloatParts p = parts_default_nan(status);
    float128 r;

    /* Extrapolate from the choices made by parts_default_nan to fill
     * in the quad-floating format.  If the low bit is set, assume we
     * want to set all non-snan bits.
     */
#ifdef _MSC_VER
    r.low = 0ULL - (p.frac & 1);
#else
    r.low = -(p.frac & 1);
#endif
    r.high = p.frac >> (DECOMPOSED_BINARY_POINT - 48);
    r.high |= UINT64_C(0x7FFF000000000000);
    r.high |= (uint64_t)p.sign << 63;

    return r;
}